

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_color.h
# Opt level: O2

color_quad<unsigned_char,_int> * __thiscall
crnlib::color_quad<unsigned_char,_int>::set
          (color_quad<unsigned_char,_int> *this,int red,int green,int blue,int alpha)

{
  int result;
  uchar uVar1;
  uchar uVar2;
  int iVar3;
  
  iVar3 = 0xff;
  if ((uint)red < 0xff) {
    iVar3 = red;
  }
  uVar1 = '\0';
  uVar2 = (uchar)iVar3;
  if (red < 0) {
    uVar2 = uVar1;
  }
  (this->field_0).field_0.r = uVar2;
  iVar3 = 0xff;
  if ((uint)green < 0xff) {
    iVar3 = green;
  }
  uVar2 = (uchar)iVar3;
  if (green < 0) {
    uVar2 = uVar1;
  }
  (this->field_0).field_0.g = uVar2;
  iVar3 = 0xff;
  if ((uint)blue < 0xff) {
    iVar3 = blue;
  }
  uVar2 = (uchar)iVar3;
  if (blue < 0) {
    uVar2 = uVar1;
  }
  (this->field_0).field_0.b = uVar2;
  iVar3 = 0xff;
  if ((uint)alpha < 0xff) {
    iVar3 = alpha;
  }
  uVar2 = (uchar)iVar3;
  if (alpha < 0) {
    uVar2 = uVar1;
  }
  (this->field_0).field_0.a = uVar2;
  return this;
}

Assistant:

inline color_quad& set(parameter_type red, parameter_type green, parameter_type blue, parameter_type alpha = component_traits::cMax)
        {
            r = static_cast<component_type>(clamp(red));
            g = static_cast<component_type>(clamp(green));
            b = static_cast<component_type>(clamp(blue));
            a = static_cast<component_type>(clamp(alpha));
            return *this;
        }